

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O2

void __thiscall
InterpreterTestSuite_PC_EnergyReport_Test::TestBody(InterpreterTestSuite_PC_EnergyReport_Test *this)

{
  TypedExpectation<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)>
  *this_00;
  char *in_R9;
  Message local_240;
  AssertHelper local_238;
  AssertionResult gtest_ar_;
  Expression expr;
  _Any_data local_200 [4];
  EnergyReport rep;
  Value value;
  TestContext ctx;
  
  InterpreterTestSuite::TestContext::TestContext(&ctx);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,&ctx);
  rep.mEnergyList.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  rep.mEnergyList.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  rep.mChannelMask.
  super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  rep.mEnergyList.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  rep.mChannelMask.
  super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  rep.mChannelMask.
  super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  testing::A<ot::commissioner::Address_const&>();
  CommissionerAppMock::gmock_GetEnergyReport
            ((MockSpec<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)> *)
             &value,ctx.mDefaultCommissionerObject.
                    super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (Matcher<const_ot::commissioner::Address_&> *)&expr);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::
            MockSpec<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)>::
            InternalExpectedAt((MockSpec<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)>
                                *)&value,
                               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                               ,0x86a,"*ctx.mDefaultCommissionerObject","GetEnergyReport(_)");
  testing::internal::ReturnAction<ot::commissioner::EnergyReport_*>::ReturnAction
            ((ReturnAction<ot::commissioner::EnergyReport_*> *)&gtest_ar_,&rep);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)> *)
             local_200,(ReturnAction *)&gtest_ar_);
  testing::internal::
  TypedExpectation<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)>::
  WillOnce(this_00,(Action<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)>
                    *)local_200);
  std::_Function_base::~_Function_base((_Function_base *)local_200);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar_.message_);
  testing::internal::MatcherBase<const_ot::commissioner::Address_&>::~MatcherBase
            ((MatcherBase<const_ot::commissioner::Address_&> *)&value.mError.mMessage);
  testing::internal::MatcherBase<const_ot::commissioner::Address_&>::~MatcherBase
            ((MatcherBase<const_ot::commissioner::Address_&> *)&expr);
  expr.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  expr.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  expr.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  value.mError.mCode = kNone;
  value.mError.mMessage._M_dataplus._M_p = (pointer)&value.mError.mMessage.field_2;
  value.mError.mMessage._M_string_length = 0;
  value.mError.mMessage.field_2._M_local_buf[0] = '\0';
  value.mData._M_dataplus._M_p = (pointer)&value.mData.field_2;
  value.mData._M_string_length = 0;
  value.mData.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string
            ((string *)local_200[0]._M_pod_data,"energy report 1234::5678",(allocator *)&local_240);
  ot::commissioner::Interpreter::ParseExpression
            ((Expression *)&gtest_ar_,&ctx.mInterpreter,(string *)local_200);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&expr,&gtest_ar_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&gtest_ar_);
  std::__cxx11::string::~string((string *)local_200[0]._M_pod_data);
  ot::commissioner::Interpreter::Eval((Value *)local_200,&ctx.mInterpreter,&expr);
  ot::commissioner::Interpreter::Value::operator=(&value,(Value *)local_200);
  ot::commissioner::Interpreter::Value::~Value((Value *)local_200);
  gtest_ar_.success_ = ot::commissioner::Interpreter::Value::HasNoError(&value);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar_.success_) {
    testing::Message::Message(&local_240);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_200,(internal *)&gtest_ar_,(AssertionResult *)0x27400f,"false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x871,(char *)local_200[0]._0_8_);
    testing::internal::AssertHelper::operator=(&local_238,&local_240);
    testing::internal::AssertHelper::~AssertHelper(&local_238);
    std::__cxx11::string::~string((string *)local_200[0]._M_pod_data);
    if (local_240.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_240.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  ot::commissioner::Interpreter::Value::~Value(&value);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&expr);
  ot::commissioner::EnergyReport::~EnergyReport(&rep);
  InterpreterTestSuite::TestContext::~TestContext(&ctx);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_EnergyReport)
{
    TestContext ctx;
    InitContext(ctx);

    EnergyReport rep;
    EXPECT_CALL(*ctx.mDefaultCommissionerObject, GetEnergyReport(_)).WillOnce(Return(&rep));

    Interpreter::Expression expr;
    Interpreter::Value      value;

    expr  = ctx.mInterpreter.ParseExpression("energy report 1234::5678");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
}